

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.h
# Opt level: O0

void __thiscall wasm::SCCs<IntIt,_GraphSCCs>::~SCCs(SCCs<IntIt,_GraphSCCs> *this)

{
  SCCs<IntIt,_GraphSCCs> *this_local;
  
  std::
  unordered_map<unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>_>
  ::~unordered_map(&this->elementInfo);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->stack);
  std::
  vector<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
  ::~vector(&this->workStack);
  return;
}

Assistant:

SCCs(It inputIt, It inputEnd) : inputIt(inputIt), inputEnd(inputEnd) {}